

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O3

void Fra_ManFinalizeComb(Fra_Man_t *p)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  ulong uVar3;
  Aig_Obj_t *pDriver;
  long lVar4;
  
  pVVar2 = p->pManAig->vCos;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      if (((ulong)pVVar2->pArray[lVar4] & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fra.h"
                      ,0x110,"Aig_Obj_t *Fra_ObjChild0Fra(Aig_Obj_t *, int)");
      }
      uVar1 = *(ulong *)((long)pVVar2->pArray[lVar4] + 8);
      uVar3 = uVar1 & 0xfffffffffffffffe;
      if (uVar3 == 0) {
        pDriver = (Aig_Obj_t *)0x0;
      }
      else {
        pDriver = (Aig_Obj_t *)
                  ((ulong)((uint)uVar1 & 1) ^
                  *(ulong *)(*(long *)(*(long *)(uVar3 + 0x28) + 0x20) +
                            (long)*(int *)(*(long *)(uVar3 + 0x28) + 0x18) *
                            (long)*(int *)(uVar3 + 0x24) * 8));
      }
      Aig_ObjCreateCo(p->pManFraig,pDriver);
      lVar4 = lVar4 + 1;
      pVVar2 = p->pManAig->vCos;
    } while (lVar4 < pVVar2->nSize);
  }
  Aig_ManCleanMarkB(p->pManFraig);
  return;
}

Assistant:

void Fra_ManFinalizeComb( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // add the POs
    Aig_ManForEachCo( p->pManAig, pObj, i )
        Aig_ObjCreateCo( p->pManFraig, Fra_ObjChild0Fra(pObj,0) );
    // postprocess
    Aig_ManCleanMarkB( p->pManFraig );
}